

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generated_enum_util_test.cc
# Opt level: O0

void __thiscall
google::protobuf::internal::anon_unknown_0::ValidateEnumTest_SequentialRangeTest_Test::TestBody
          (ValidateEnumTest_SequentialRangeTest_Test *this)

{
  ElementsAreMatcher<std::tuple<int,_int,_int>_> matcher;
  ElementsAreMatcher<std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int>_> matcher_00;
  initializer_list<unsigned_int> v;
  initializer_list<unsigned_int> v_00;
  initializer_list<unsigned_int> v_01;
  bool bVar1;
  char *pcVar2;
  _Head_base<1UL,_int,_false> in_stack_fffffffffffffdb4;
  _Head_base<0UL,_int,_false> in_stack_fffffffffffffdb8;
  int *in_stack_fffffffffffffdd0;
  AssertHelper local_1e8;
  Message local_1e0;
  uint32_t local_1d8;
  uint32_t local_1d4;
  iterator local_1d0;
  undefined8 local_1c8;
  Span<const_unsigned_int> local_1c0;
  vector<int,_std::allocator<int>_> local_1b0;
  int local_198 [9];
  undefined4 local_174;
  undefined1 local_170 [40];
  char local_148 [40];
  undefined1 local_120 [8];
  AssertionResult gtest_ar_2;
  Message local_108;
  uint32_t local_100;
  uint32_t local_fc;
  iterator local_f8;
  undefined8 local_f0;
  Span<const_unsigned_int> local_e8;
  vector<int,_std::allocator<int>_> local_d8;
  int local_bc [3];
  testing local_b0 [8];
  _Tuple_impl<2UL,_int> local_a8;
  char local_a4 [12];
  undefined1 local_98 [8];
  AssertionResult gtest_ar_1;
  Message local_80 [3];
  uint local_68 [2];
  iterator local_60;
  undefined8 local_58;
  Span<const_unsigned_int> local_50;
  vector<int,_std::allocator<int>_> local_40;
  char local_21;
  undefined1 local_20 [8];
  AssertionResult gtest_ar;
  ValidateEnumTest_SequentialRangeTest_Test *this_local;
  
  gtest_ar.message_._M_t.
  super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_t.
  super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  .
  super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  ._M_head_impl =
       (__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
        )(__uniq_ptr_data<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_true,_true>
          )this;
  testing::ElementsAre<>();
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<>>>();
  local_68[0] = 0;
  local_68[1] = 0;
  local_60 = local_68;
  local_58 = 2;
  v_01._M_len = 2;
  v_01._M_array = local_60;
  absl::lts_20250127::Span<unsigned_int_const>::Span<unsigned_int_const,unsigned_int_const>
            ((Span<unsigned_int_const> *)&local_50,v_01);
  GetValidValues(&local_40,local_50,-100,100);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<>>>::operator()
            (local_20,&local_21,
             (vector<int,_std::allocator<int>_> *)"GetValidValues({0, 0}, -100, 100)");
  std::vector<int,_std::allocator<int>_>::~vector(&local_40);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_20);
  if (!bVar1) {
    testing::Message::Message(local_80);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_20);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_1.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util_test.cc"
               ,0xa9,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_1.message_,local_80);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_1.message_);
    testing::Message::~Message(local_80);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_20);
  local_bc[2] = 5;
  local_bc[1] = 6;
  local_bc[0] = 7;
  testing::ElementsAre<int,int,int>(local_b0,local_bc + 2,local_bc + 1,local_bc);
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Head_base<1UL,_int,_false>._M_head_impl = in_stack_fffffffffffffdb4._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int>.super__Tuple_impl<1UL,_int,_int>.
  super__Tuple_impl<2UL,_int>.super__Head_base<2UL,_int,_false>._M_head_impl =
       local_a8.super__Head_base<2UL,_int,_false>._M_head_impl;
  matcher.matchers_.super__Tuple_impl<0UL,_int,_int,_int>.super__Head_base<0UL,_int,_false>.
  _M_head_impl = in_stack_fffffffffffffdb8._M_head_impl;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int>>>
            (matcher);
  local_100 = Make32(5,3);
  local_fc = Make32(0,0);
  local_f8 = &local_100;
  local_f0 = 2;
  v_00._M_len = 2;
  v_00._M_array = local_f8;
  absl::lts_20250127::Span<unsigned_int_const>::Span<unsigned_int_const,unsigned_int_const>
            ((Span<unsigned_int_const> *)&local_e8,v_00);
  GetValidValues(&local_d8,local_e8,-100,100);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int>>>::
  operator()(local_98,local_a4,
             (vector<int,_std::allocator<int>_> *)
             "GetValidValues( { Make32(5, 3), Make32(0, 0)}, -100, 100)");
  std::vector<int,_std::allocator<int>_>::~vector(&local_d8);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_98);
  if (!bVar1) {
    testing::Message::Message(&local_108);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_98);
    testing::internal::AssertHelper::AssertHelper
              ((AssertHelper *)&gtest_ar_2.message_,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util_test.cc"
               ,0xb0,pcVar2);
    testing::internal::AssertHelper::operator=((AssertHelper *)&gtest_ar_2.message_,&local_108);
    testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&gtest_ar_2.message_);
    testing::Message::~Message(&local_108);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_98);
  local_174 = 0xfffffffe;
  local_198[8] = 0xffffffff;
  local_198[7] = 0;
  local_198[6] = 1;
  local_198[5] = 2;
  local_198[4] = 3;
  local_198[3] = 4;
  local_198[2] = 5;
  local_198[1] = 6;
  local_198[0] = 7;
  testing::ElementsAre<int,int,int,int,int,int,int,int,int,int>
            ((ElementsAreMatcher<std::tuple<int,_int,_int,_int,_int,_int,_int,_int,_int,_int>_> *)
             local_170,(testing *)&local_174,local_198 + 8,local_198 + 7,local_198 + 6,local_198 + 5
             ,local_198 + 4,local_198 + 3,local_198 + 2,local_198 + 1,local_198,
             in_stack_fffffffffffffdd0);
  matcher_00.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<4UL,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<5UL,_int,_int,_int,_int,_int>.super__Tuple_impl<6UL,_int,_int,_int,_int>.
  super__Tuple_impl<7UL,_int,_int,_int>.super__Head_base<7UL,_int,_false>._M_head_impl =
       (int)local_170._16_8_;
  matcher_00.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<4UL,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<5UL,_int,_int,_int,_int,_int>.super__Tuple_impl<6UL,_int,_int,_int,_int>.
  super__Tuple_impl<7UL,_int,_int,_int>.super__Tuple_impl<8UL,_int,_int>.super__Tuple_impl<9UL,_int>
  .super__Head_base<9UL,_int,_false>._M_head_impl =
       (_Head_base<9UL,_int,_false>)(_Head_base<9UL,_int,_false>)local_170._8_4_;
  matcher_00.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<4UL,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<5UL,_int,_int,_int,_int,_int>.super__Tuple_impl<6UL,_int,_int,_int,_int>.
  super__Tuple_impl<7UL,_int,_int,_int>.super__Tuple_impl<8UL,_int,_int>.
  super__Head_base<8UL,_int,_false>._M_head_impl = local_170._12_4_;
  matcher_00.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<4UL,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<5UL,_int,_int,_int,_int,_int>.super__Tuple_impl<6UL,_int,_int,_int,_int>.
  super__Head_base<6UL,_int,_false>._M_head_impl = SUB84(local_170._16_8_,4);
  matcher_00.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<4UL,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<5UL,_int,_int,_int,_int,_int>.super__Head_base<5UL,_int,_false>._M_head_impl =
       local_170._24_4_;
  matcher_00.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<4UL,_int,_int,_int,_int,_int,_int>.super__Head_base<4UL,_int,_false>.
  _M_head_impl = local_170._28_4_;
  matcher_00.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<3UL,_int,_int,_int,_int,_int,_int,_int>.super__Head_base<3UL,_int,_false>.
  _M_head_impl = local_170._32_4_;
  matcher_00.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<1UL,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  super__Tuple_impl<2UL,_int,_int,_int,_int,_int,_int,_int,_int>.super__Head_base<2UL,_int,_false>.
  _M_head_impl = local_170._36_4_;
  matcher_00.matchers_.super__Tuple_impl<0UL,_int,_int,_int,_int,_int,_int,_int,_int,_int,_int>.
  _32_8_ = in_stack_fffffffffffffdd0;
  testing::internal::
  MakePredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int,int,int,int,int,int,int>>>
            (matcher_00);
  local_1d8 = Make32(0xfffe,10);
  local_1d4 = Make32(0,0);
  local_1d0 = &local_1d8;
  local_1c8 = 2;
  v._M_len = 2;
  v._M_array = local_1d0;
  absl::lts_20250127::Span<unsigned_int_const>::Span<unsigned_int_const,unsigned_int_const>
            ((Span<unsigned_int_const> *)&local_1c0,v);
  GetValidValues(&local_1b0,local_1c0,-100,100);
  testing::internal::
  PredicateFormatterFromMatcher<testing::internal::ElementsAreMatcher<std::tuple<int,int,int,int,int,int,int,int,int,int>>>
  ::operator()(local_120,local_148,
               (vector<int,_std::allocator<int>_> *)
               "GetValidValues( { Make32(-2, 10), Make32(0, 0)}, -100, 100)");
  std::vector<int,_std::allocator<int>_>::~vector(&local_1b0);
  bVar1 = testing::AssertionResult::operator_cast_to_bool((AssertionResult *)local_120);
  if (!bVar1) {
    testing::Message::Message(&local_1e0);
    pcVar2 = testing::AssertionResult::failure_message((AssertionResult *)local_120);
    testing::internal::AssertHelper::AssertHelper
              (&local_1e8,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/protocolbuffers[P]protobuf/src/google/protobuf/generated_enum_util_test.cc"
               ,0xb7,pcVar2);
    testing::internal::AssertHelper::operator=(&local_1e8,&local_1e0);
    testing::internal::AssertHelper::~AssertHelper(&local_1e8);
    testing::Message::~Message(&local_1e0);
  }
  testing::AssertionResult::~AssertionResult((AssertionResult *)local_120);
  return;
}

Assistant:

TEST(ValidateEnumTest, SequentialRangeTest) {
  EXPECT_THAT(GetValidValues({0, 0}, -100, 100), ElementsAre());
  EXPECT_THAT(GetValidValues(
                  {// sequence start=3, length=3
                   Make32(5, 3),
                   // no bitmap, no fallback
                   Make32(0, 0)},
                  -100, 100),
              ElementsAre(5, 6, 7));
  EXPECT_THAT(GetValidValues(
                  {// sequence start=-2, length=10
                   Make32(-2, 10),
                   // no bitmap, no fallback
                   Make32(0, 0)},
                  -100, 100),
              ElementsAre(-2, -1, 0, 1, 2, 3, 4, 5, 6, 7));
}